

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

void __thiscall gl4cts::CopyImage::InvalidTargetTest::clean(InvalidTargetTest *this)

{
  uint uVar1;
  GLenum GVar2;
  pointer ptVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  GLuint local_38;
  GLuint local_34;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  uVar1 = this->m_test_case_index;
  ptVar3 = (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  GVar2 = ptVar3[uVar1].m_dst_target;
  local_38 = this->m_dst_tex_name;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)((ulong)(GVar2 != 0x8d41) * 0x20 + 0x460 + CONCAT44(extraout_var_00,iVar5)))
            (1,&local_38);
  GVar2 = ptVar3[uVar1].m_src_target;
  local_34 = this->m_src_tex_name;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)((ulong)(GVar2 != 0x8d41) * 0x20 + 0x460 + CONCAT44(extraout_var_01,iVar5)))
            (1,&local_34);
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  if (this->m_dst_buf_name != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar4) + 0x438))(1,&this->m_dst_buf_name);
    this->m_dst_buf_name = 0;
  }
  if (this->m_src_buf_name != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar4) + 0x438))(1,&this->m_src_buf_name);
    this->m_src_buf_name = 0;
  }
  return;
}

Assistant:

void InvalidTargetTest::clean()
{
	const Functions& gl		   = m_context.getRenderContext().getFunctions();
	const testCase&  test_case = m_test_cases[m_test_case_index];

	/* Clean textures and buffers. Errors ignored */
	Utils::deleteTexture(m_context, test_case.m_dst_target, m_dst_tex_name);
	Utils::deleteTexture(m_context, test_case.m_src_target, m_src_tex_name);

	m_dst_tex_name = 0;
	m_src_tex_name = 0;

	if (0 != m_dst_buf_name)
	{
		gl.deleteBuffers(1, &m_dst_buf_name);
		m_dst_buf_name = 0;
	}

	if (0 != m_src_buf_name)
	{
		gl.deleteBuffers(1, &m_src_buf_name);
		m_src_buf_name = 0;
	}
}